

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O0

void __thiscall lan::db_bit::db_bit(db_bit *this)

{
  db_bit *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::clear();
  this->data = (void *)0x0;
  this->pre = (db_bit *)0x0;
  this->nex = (db_bit *)0x0;
  this->lin = (db_bit *)0x0;
  this->con = (db_bit *)0x0;
  return;
}

Assistant:

db_bit(){
            key.clear();
            data = nullptr;
            pre  = nullptr;
            nex  = nullptr;
            lin  = nullptr;
            con  = nullptr; 
        }